

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

char * mfgets(char *s,int size,mFILE *mf)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar5;
  ulong uVar6;
  int iVar4;
  
  if (m_channel_0 == mf) {
    init_mstdin();
  }
  *s = '\0';
  iVar4 = 1;
  if (1 < size) {
    iVar4 = size;
  }
  uVar3 = iVar4 - 1;
  uVar6 = 0;
  while( true ) {
    if (uVar3 == uVar6) goto LAB_0012b17f;
    uVar2 = mf->offset;
    if (mf->size <= uVar2) break;
    mf->offset = uVar2 + 1;
    cVar1 = mf->data[uVar2];
    s[uVar6] = cVar1;
    uVar6 = uVar6 + 1;
    if (cVar1 == '\n') {
LAB_0012b17d:
      uVar3 = (uint)uVar6;
LAB_0012b17f:
      s[(int)uVar3] = '\0';
      pcVar5 = (char *)0x0;
      if (uVar3 != 0) {
        pcVar5 = s;
      }
      return pcVar5;
    }
  }
  mf->eof = 1;
  goto LAB_0012b17d;
}

Assistant:

char *mfgets(char *s, int size, mFILE *mf) {
    int i;

    if (mf == m_channel[0]) init_mstdin();
    *s = 0;
    for (i = 0; i < size-1;) {
	if (mf->offset < mf->size) {
	    s[i] = mf->data[mf->offset++];
	    if (s[i++] == '\n')
		break;
	} else {
	    mf->eof = 1;
	    break;
	}
    }

    s[i] = 0;
    return i ? s : NULL;
}